

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-file.c
# Opt level: O3

_Bool file_newer(char *first,char *second)

{
  bool bVar1;
  int iVar2;
  stat stat2;
  stat stat1;
  stat sStack_128;
  stat local_98;
  
  iVar2 = stat(first,&local_98);
  if (iVar2 == 0) {
    iVar2 = stat(second,&sStack_128);
    bVar1 = true;
    if (iVar2 == 0) {
      bVar1 = sStack_128.st_mtim.tv_sec < local_98.st_mtim.tv_sec;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool file_newer(const char *first, const char *second)
{
#ifdef HAVE_STAT
	struct stat stat1, stat2;

	/* If the first doesn't exist, the first is not newer. */
	if (stat(first, &stat1) != 0) return false;

	/* If the second doesn't exist, the first is always newer. */
	if (stat(second, &stat2) != 0) return true;

	/* Compare modification times. */
	return stat1.st_mtime > stat2.st_mtime ? true : false;
#else /* HAVE_STAT */
	return false;
#endif /* !HAVE_STAT */
}